

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O0

uint __thiscall
siamese::DecoderPacketWindow::FindNextGotElement(DecoderPacketWindow *this,uint elementStart)

{
  int iVar1;
  uint in_ESI;
  long in_RDI;
  uint nextElement;
  uint bitIndex;
  uint subwindowIndex;
  uint subwindowEnd;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_20;
  
  if (in_ESI < *(uint *)(in_RDI + 0x28)) {
    iVar1 = *(int *)(in_RDI + 0x28);
    local_38 = in_ESI & 0x3f;
    for (local_34 = in_ESI >> 6; local_34 < iVar1 + 0x3fU >> 6; local_34 = local_34 + 1) {
      if ((*(int *)(*(long *)(*(long *)(in_RDI + 0x108) + (long)(int)local_34 * 8) + 0x608) != 0) &&
         (local_3c = pktalloc::CustomBitSet<64U>::FindFirstSet
                               ((CustomBitSet<64U> *)
                                (*(long *)(*(long *)(in_RDI + 0x108) + (long)(int)local_34 * 8) +
                                0x600),local_38,0x40), local_3c < 0x40)) {
        local_3c = local_34 * 0x40 + local_3c;
        if (*(uint *)(in_RDI + 0x28) < local_3c) {
          local_3c = *(uint *)(in_RDI + 0x28);
        }
        return local_3c;
      }
      local_38 = 0;
    }
    local_20 = *(uint *)(in_RDI + 0x28);
  }
  else {
    local_20 = *(uint *)(in_RDI + 0x28);
  }
  return local_20;
}

Assistant:

unsigned DecoderPacketWindow::FindNextGotElement(unsigned elementStart)
{
    if (elementStart >= Count) {
        return Count;
    }

    const unsigned subwindowEnd = (Count + kSubwindowSize - 1) / kSubwindowSize;
    unsigned subwindowIndex = elementStart / kSubwindowSize;
    unsigned bitIndex = elementStart % kSubwindowSize;
    SIAMESE_DEBUG_ASSERT(subwindowEnd <= Subwindows.GetSize());
    SIAMESE_DEBUG_ASSERT(subwindowIndex < Subwindows.GetSize());

    while (subwindowIndex < subwindowEnd)
    {
        // If there may be any got packets in this subwindow:
        if (Subwindows.GetRef(subwindowIndex)->GotCount > 0)
        {
            for (;;)
            {
                // Seek next set bit
                bitIndex = Subwindows.GetRef(subwindowIndex)->Got.FindFirstSet(bitIndex);

                // If there were none, skip this subwindow
                if (bitIndex >= kSubwindowSize) {
                    break;
                }

                // Calculate element index and stop if we hit the end of the valid data
                unsigned nextElement = subwindowIndex * kSubwindowSize + bitIndex;
                if (nextElement > Count) {
                    nextElement = Count;
                }

                return nextElement;
            }
        }

        // Reset bit index to the front of the next subwindow
        bitIndex = 0;

        // Check next subwindow
        ++subwindowIndex;
    }

    return Count;
}